

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

void megumax::stats(Position *pos,UCTNode *node)

{
  pointer pUVar1;
  bool bVar2;
  int iVar3;
  UCTNode *this;
  ostream *poVar4;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar5;
  uint __val;
  double dVar6;
  string local_50;
  
  forward_position(pos,node);
  libchess::Position::display(pos,(ostream *)&std::cout);
  this = UCTNode::parent(node);
  poVar4 = std::operator<<((ostream *)&std::cout,"depth: ");
  iVar3 = UCTNode::depth(node);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"visits: ");
  iVar3 = UCTNode::visits(node);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"score: ");
  dVar6 = UCTNode::score(node);
  poVar4 = std::ostream::_M_insert<double>(dVar6);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"P: ");
  dVar6 = UCTNode::p(node,pos);
  poVar4 = std::ostream::_M_insert<double>(dVar6);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"Q: ");
  dVar6 = UCTNode::score(node);
  iVar3 = UCTNode::visits(node);
  poVar4 = std::ostream::_M_insert<double>(dVar6 / (double)iVar3);
  std::operator<<(poVar4,"\n");
  if (this != (UCTNode *)0x0) {
    pvVar5 = UCTNode::children(this);
    pUVar1 = (pvVar5->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
             _M_impl.super__Vector_impl_data._M_start;
    std::operator<<((ostream *)&std::cout,"U: ");
    dVar6 = UCTNode::child_probability(this,((long)node - (long)pUVar1) / 0x58);
    poVar4 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar4,"\n");
  }
  bVar2 = UCTNode::is_terminal(node);
  __val = 0;
  if (!bVar2) {
    pvVar5 = UCTNode::children(node);
    __val = (uint)((pvVar5->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)
                   ._M_impl.super__Vector_impl_data._M_start !=
                  (pvVar5->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                  _M_impl.super__Vector_impl_data._M_finish);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"expanded: ");
  std::__cxx11::to_string(&local_50,__val);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  iVar3 = UCTNode::depth(node);
  rewind_position(pos,iVar3);
  return;
}

Assistant:

void stats(Position& pos, UCTNode* node) {
    forward_position(pos, node);

    pos.display();
    UCTNode* parent = node->parent();
    std::cout << "depth: " << node->depth() << "\n"
              << "visits: " << node->visits() << "\n"
              << "score: " << node->score() << "\n"
              << "P: " << node->p(pos) << "\n"
              << "Q: " << node->score() / node->visits() << "\n";
    if (parent != nullptr) {
        auto parent_relative_idx = node - parent->children().data();
        std::cout << "U: " << parent->child_probability(parent_relative_idx) << "\n";
    }
    bool is_expanded = (!node->is_terminal() && !node->children().empty());
    std::cout << "expanded: " << std::to_string(is_expanded) << "\n";

    rewind_position(pos, node->depth());
}